

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O0

void __thiscall solitaire::Solitaire::trySelectNextStockPileCard(Solitaire *this)

{
  bool bVar1;
  element_type *peVar2;
  pointer pHVar3;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  local_30 [3];
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  local_18;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  snapshot;
  Solitaire *this_local;
  
  snapshot._M_t.
  super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl =
       (__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
        )(__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
          )this;
  bVar1 = shouldSelectNextStockPileCard(this);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<solitaire::piles::interfaces::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<solitaire::piles::interfaces::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->stockPile);
    (*(peVar2->super_Archiver)._vptr_Archiver[2])(&local_18);
    peVar2 = std::
             __shared_ptr_access<solitaire::piles::interfaces::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<solitaire::piles::interfaces::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->stockPile);
    (*(peVar2->super_Archiver)._vptr_Archiver[4])();
    pHVar3 = std::
             unique_ptr<solitaire::archivers::interfaces::HistoryTracker,_std::default_delete<solitaire::archivers::interfaces::HistoryTracker>_>
             ::operator->(&this->historyTracker);
    std::
    unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ::unique_ptr(local_30,&local_18);
    (*pHVar3->_vptr_HistoryTracker[3])(pHVar3,local_30);
    std::
    unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ::~unique_ptr(local_30);
    std::
    unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ::~unique_ptr(&local_18);
  }
  return;
}

Assistant:

void Solitaire::trySelectNextStockPileCard() {
    if (shouldSelectNextStockPileCard()) {
        auto snapshot = stockPile->createSnapshot();
        stockPile->trySelectNextCard();
        historyTracker->save(std::move(snapshot));
    }
}